

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadSpotLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  float fVar1;
  pointer pcVar2;
  undefined8 *in_RDX;
  XMLLoader *this_00;
  string *childID;
  XMLLoader *this_01;
  XMLLoader *this_02;
  Vec3fa VVar3;
  Vec3fa I;
  AffineSpace3fa space;
  undefined1 local_b8 [12];
  float local_ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [4];
  float fStack_94;
  undefined1 uStack_90;
  undefined2 uStack_8f;
  undefined1 uStack_8d;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  SharedState *local_68;
  size_type sStack_60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  this_01 = (XMLLoader *)local_b8;
  this_02 = (XMLLoader *)local_b8;
  this_00 = (XMLLoader *)*in_RDX;
  local_98._0_2_ = 0x6641;
  local_98._2_2_ = 0x6966;
  fStack_94 = 2.6169583e+29;
  uStack_90 = 0x61;
  uStack_8f = 0x6563;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
  uStack_8d = 0;
  local_a8._M_allocated_capacity = (size_type)(element_type *)local_98;
  XML::child((XML *)&local_78,(string *)this_00);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)&local_58.field_1,this_00,
             (Ref<embree::XML> *)&local_78._M_allocated_capacity);
  if ((long *)local_78._M_allocated_capacity != (long *)0x0) {
    (**(code **)(*(long *)local_78._M_allocated_capacity + 0x18))();
  }
  if ((element_type *)local_a8._M_allocated_capacity != (element_type *)local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity);
  }
  childID = (string *)*in_RDX;
  local_98._0_2_ = 0x49;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_a8._M_allocated_capacity = (size_type)(element_type *)local_98;
  XML::child((XML *)local_b8,childID);
  VVar3 = load<embree::Vec3fa>((XMLLoader *)&local_78,(Ref<embree::XML> *)childID);
  if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))(VVar3.field_0._0_4_,VVar3.field_0._8_4_);
  }
  if ((element_type *)local_a8._M_allocated_capacity != (element_type *)local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity);
  }
  local_98._0_2_ = 0x6e61;
  local_98._2_2_ = 0x6c67;
  fStack_94 = 1.8050893e+28;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
  uStack_90 = 0;
  local_a8._M_allocated_capacity = (size_type)(element_type *)local_98;
  XML::child((XML *)local_b8,(string *)*in_RDX);
  local_ac = load<float>(this_01,(Ref<embree::XML> *)local_b8);
  if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
  }
  if ((element_type *)local_a8._M_allocated_capacity != (element_type *)local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity);
  }
  local_98._0_2_ = 0x6e61;
  local_98._2_2_ = 0x6c67;
  fStack_94 = 1.8278696e+34;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
  uStack_90 = 0;
  local_a8._M_allocated_capacity = (size_type)(element_type *)local_98;
  XML::child((XML *)local_b8,(string *)*in_RDX);
  local_b8._8_4_ = load<float>(this_02,(Ref<embree::XML> *)local_b8);
  if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
  }
  if ((element_type *)local_a8._M_allocated_capacity != (element_type *)local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity);
  }
  local_a8._M_allocated_capacity = 0;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98._0_2_ = 0;
  local_98._2_2_ = 0;
  fStack_94 = 0.0;
  uStack_90 = 0;
  uStack_8f = 0x8000;
  uStack_8d = 0x3f;
  uStack_8c = 0;
  local_68 = (SharedState *)local_78._M_allocated_capacity;
  sStack_60 = local_78._8_8_;
  local_88._0_8_ = local_78._M_allocated_capacity;
  local_88._8_8_ = local_78._8_8_;
  pcVar2 = (pointer)alignedMalloc(0xc0,0x10);
  fVar1 = (float)CONCAT13(uStack_8d,CONCAT21(uStack_8f,uStack_90));
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  *(pointer *)(pcVar2 + 0x10) = pcVar2 + 0x20;
  pcVar2[0x18] = '\0';
  pcVar2[0x19] = '\0';
  pcVar2[0x1a] = '\0';
  pcVar2[0x1b] = '\0';
  pcVar2[0x1c] = '\0';
  pcVar2[0x1d] = '\0';
  pcVar2[0x1e] = '\0';
  pcVar2[0x1f] = '\0';
  pcVar2[0x20] = '\0';
  *(pointer *)(pcVar2 + 0x30) = pcVar2 + 0x40;
  pcVar2[0x38] = '\0';
  pcVar2[0x39] = '\0';
  pcVar2[0x3a] = '\0';
  pcVar2[0x3b] = '\0';
  pcVar2[0x3c] = '\0';
  pcVar2[0x3d] = '\0';
  pcVar2[0x3e] = '\0';
  pcVar2[0x3f] = '\0';
  pcVar2[0x40] = '\0';
  pcVar2[0x50] = '\0';
  pcVar2[0x51] = '\0';
  pcVar2[0x52] = '\0';
  pcVar2[0x53] = '\0';
  pcVar2[0x54] = '\0';
  pcVar2[0x55] = '\0';
  pcVar2[0x56] = '\0';
  pcVar2[0x57] = '\0';
  pcVar2[0x58] = '\0';
  pcVar2[0x59] = '\0';
  pcVar2[0x5c] = -1;
  pcVar2[0x5d] = -1;
  pcVar2[0x5e] = -1;
  pcVar2[0x5f] = -1;
  pcVar2[0x60] = '\0';
  pcVar2[0x61] = '\0';
  pcVar2[0x62] = '\0';
  pcVar2[99] = '\0';
  pcVar2[100] = '\0';
  pcVar2[0x65] = '\0';
  pcVar2[0x66] = '\0';
  pcVar2[0x67] = '\0';
  *(undefined ***)pcVar2 = &PTR__Node_002bff88;
  pcVar2[0x70] = '\x03';
  pcVar2[0x71] = '\0';
  pcVar2[0x72] = '\0';
  pcVar2[0x73] = '\0';
  *(float *)(pcVar2 + 0x80) =
       (float)local_a8._M_allocated_capacity._4_4_ * local_48 +
       (float)local_a8._8_4_ * local_38 + local_28 + local_58.m128[0] * 0.0;
  *(float *)(pcVar2 + 0x84) =
       (float)local_a8._M_allocated_capacity._4_4_ * fStack_44 +
       (float)local_a8._8_4_ * fStack_34 + fStack_24 + local_58.m128[1] * 0.0;
  *(float *)(pcVar2 + 0x88) =
       (float)local_a8._M_allocated_capacity._4_4_ * fStack_40 +
       (float)local_a8._8_4_ * fStack_30 + fStack_20 + local_58.m128[2] * 0.0;
  *(float *)(pcVar2 + 0x8c) =
       (float)local_a8._M_allocated_capacity._4_4_ * fStack_3c +
       (float)local_a8._8_4_ * fStack_2c + fStack_1c + local_58.m128[3] * 0.0;
  *(float *)(pcVar2 + 0x90) = fStack_94 * local_48 + fVar1 * local_38 + local_58.m128[0] * 0.0;
  *(float *)(pcVar2 + 0x94) = fStack_94 * fStack_44 + fVar1 * fStack_34 + local_58.m128[1] * 0.0;
  *(float *)(pcVar2 + 0x98) = fStack_94 * fStack_40 + fVar1 * fStack_30 + local_58.m128[2] * 0.0;
  *(float *)(pcVar2 + 0x9c) = fStack_94 * fStack_3c + fVar1 * fStack_2c + local_58.m128[3] * 0.0;
  *(SharedState **)(pcVar2 + 0xa0) = local_68;
  *(size_type *)(pcVar2 + 0xa8) = sStack_60;
  *(float *)(pcVar2 + 0xb0) = local_ac;
  *(undefined4 *)(pcVar2 + 0xb4) = local_b8._8_4_;
  (this->path).filename._M_dataplus._M_p = pcVar2;
  LOCK();
  *(long *)(pcVar2 + 8) = *(long *)(pcVar2 + 8) + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadSpotLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa I = load<Vec3fa>(xml->child("I"));
    const Vec3fa P = Vec3fa(zero);
    const Vec3fa D = Vec3fa(0,0,1);
    const float angleMin = load<float>(xml->child("angleMin"));
    const float angleMax = load<float>(xml->child("angleMax"));
    const SceneGraph::SpotLight light = SceneGraph::SpotLight(P,D,I,angleMin,angleMax);
    return new SceneGraph::LightNodeImpl<SceneGraph::SpotLight>(light.transform(space));
  }